

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_dart_struct_writer(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  e_req eVar1;
  pointer pcVar2;
  t_field *tfield;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  t_dart_generator *this_00;
  pointer pptVar7;
  string field_name;
  string local_1a0;
  e_req local_17c;
  string local_178;
  t_struct *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_158 = tstruct;
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"write(TProtocol oprot)",0x16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"validate();",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"oprot.writeStructBegin(_STRUCT_DESC);",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar7 = (local_158->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_158->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_150 = &local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      paVar3 = local_150;
      iVar5 = tolower((int)local_150->_M_local_buf[0]);
      paVar3->_M_local_buf[0] = (char)iVar5;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      if (local_150 == &local_140) {
        local_1a0.field_2._8_8_ = local_140._8_8_;
      }
      else {
        local_1a0._M_dataplus._M_p = (pointer)local_150;
      }
      local_1a0.field_2._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
      local_1a0.field_2._M_local_buf[0] = local_140._M_local_buf[0];
      local_1a0._M_string_length = local_148;
      local_148 = 0;
      local_140._M_local_buf[0] = '\0';
      eVar1 = (*pptVar7)->req_;
      local_150 = &local_140;
      if (eVar1 == T_OPTIONAL) {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (",4);
        generate_isset_check_abi_cxx11_(&local_178,this,*pptVar7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_178._M_dataplus._M_p,local_178._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0," ","");
        scope_up(this,out,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      local_17c = eVar1;
      bVar4 = type_can_be_null(this,(*pptVar7)->type_);
      if (bVar4) {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (this.",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," != null)",9);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
        scope_up(this,out,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.writeFieldBegin(_",0x17);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      this_00 = (t_dart_generator *)((*pptVar7)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,this_00,
                 (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + ((*pptVar7)->name_)._M_string_length));
      constant_name(&local_178,this_00,&local_b0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_178._M_dataplus._M_p,local_178._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_FIELD_DESC);",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      tfield = *pptVar7;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"this.","");
      generate_serialize_field(this,out,tfield,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.writeFieldEnd();",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (bVar4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
      }
      if (local_17c == T_OPTIONAL) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_158->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.writeFieldStop();",0x17);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.writeStructEnd();",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "write(TProtocol oprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl2;

  indent(out) << "oprot.writeStructBegin(_STRUCT_DESC);" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_name = get_member_name((*f_iter)->get_name());
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }
    bool null_allowed = type_can_be_null((*f_iter)->get_type());
    if (null_allowed) {
      indent(out) << "if (this." << field_name << " != null)";
      scope_up(out);
    }

    indent(out) << "oprot.writeFieldBegin(_" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    if (null_allowed) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }
  }
  // Write the struct map
  indent(out) << "oprot.writeFieldStop();" << endl << indent() << "oprot.writeStructEnd();"
      << endl;

  scope_down(out, endl2);
}